

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O1

Chain __thiscall S2Polyline::Shape::chain(Shape *this,int i)

{
  int iVar1;
  int iVar2;
  S2LogMessage SStack_18;
  
  if (i == 0) {
    iVar1 = this->polyline_->num_vertices_;
    iVar2 = 1;
    if (1 < iVar1) {
      iVar2 = iVar1;
    }
    return (Chain)((ulong)(iVar2 - 1) << 0x20);
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
             ,0x283,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: (i) == (0) ",0x19);
  abort();
}

Assistant:

S2Shape::Chain S2Polyline::Shape::chain(int i) const {
  S2_DCHECK_EQ(i, 0);
  return Chain(0, Shape::num_edges());  // Avoid virtual call.
}